

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIfCommand.cxx
# Opt level: O2

bool __thiscall
cmIfFunctionBlocker::IsFunctionBlocked
          (cmIfFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *inStatus)

{
  uint *puVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  cmake *pcVar6;
  int iVar7;
  pointer lff_00;
  cmExecutionStatus status;
  MessageType messType;
  string errorString;
  undefined1 local_1a0 [8];
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  cmListFileBacktrace bt;
  undefined1 local_160 [16];
  string err;
  cmListFileContext conditionContext;
  cmConditionEvaluator conditionEvaluator;
  cmListFileContext local_78;
  
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lff,
                          "if");
  if (bVar3) {
    this->ScopeDepth = this->ScopeDepth + 1;
  }
  else {
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lff
                            ,"endif");
    if (bVar3) {
      puVar1 = &this->ScopeDepth;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        cmMakefile::RemoveFunctionBlocker
                  ((cmMakefile *)local_1a0,(cmFunctionBlocker *)mf,(cmListFileFunction *)this);
        bVar3 = local_1a0 != (undefined1  [8])0x0;
        if (!bVar3) {
          return bVar3;
        }
        status.ReturnInvoked = false;
        status.BreakInvoked = false;
        status.ContinueInvoked = false;
        status.NestedError = false;
        lff_00 = (this->Functions).
                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl
                 .super__Vector_impl_data._M_start;
        pcVar2 = (this->Functions).
                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        iVar7 = 0;
        do {
          if (lff_00 == pcVar2) {
LAB_0018f322:
            if (local_1a0 == (undefined1  [8])0x0) {
              return bVar3;
            }
            (*(code *)(*(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         **)local_1a0)[1].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)();
            return bVar3;
          }
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)lff_00,"if");
          bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)lff_00,"endif");
          iVar7 = (iVar7 + (uint)bVar4) - (uint)bVar5;
          if (iVar7 == 0) {
            bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)lff_00,"else");
            if (bVar4) {
              if (this->ElseSeen == true) {
                cmMakefile::GetBacktrace((cmMakefile *)&conditionContext,(cmCommandContext *)mf);
                pcVar6 = cmMakefile::GetCMakeInstance(mf);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&conditionEvaluator,
                           "A duplicate ELSE command was found inside an IF block.",
                           (allocator<char> *)&errorString);
                cmake::IssueMessage(pcVar6,FATAL_ERROR,(string *)&conditionEvaluator,
                                    (cmListFileBacktrace *)&conditionContext);
LAB_0018f2fe:
                std::__cxx11::string::~string((string *)&conditionEvaluator);
                cmSystemTools::s_FatalErrorOccured = true;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                           &conditionContext.Name._M_string_length);
                goto LAB_0018f322;
              }
              bVar4 = this->HasRun;
              this->IsBlocking = bVar4;
              this->HasRun = true;
              this->ElseSeen = true;
              if ((bVar4 == false) &&
                 (pcVar6 = cmMakefile::GetCMakeInstance(mf), pcVar6->Trace == true)) {
                cmMakefile::PrintCommandTrace(mf,lff_00);
              }
            }
            else {
              bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)lff_00,"elseif");
              if (!bVar4) goto LAB_0018efa3;
              if (this->ElseSeen == true) {
                cmMakefile::GetBacktrace((cmMakefile *)&conditionContext,(cmCommandContext *)mf);
                pcVar6 = cmMakefile::GetCMakeInstance(mf);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&conditionEvaluator,
                           "An ELSEIF command was found after an ELSE command.",
                           (allocator<char> *)&errorString);
                cmake::IssueMessage(pcVar6,FATAL_ERROR,(string *)&conditionEvaluator,
                                    (cmListFileBacktrace *)&conditionContext);
                goto LAB_0018f2fe;
              }
              if (this->HasRun == true) {
                this->IsBlocking = true;
              }
              else {
                pcVar6 = cmMakefile::GetCMakeInstance(mf);
                if (pcVar6->Trace == true) {
                  cmMakefile::PrintCommandTrace(mf,lff_00);
                }
                errorString._M_dataplus._M_p = (pointer)&errorString.field_2;
                errorString._M_string_length = 0;
                errorString.field_2._M_local_buf[0] = '\0';
                expandedArguments.
                super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                expandedArguments.
                super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                expandedArguments.
                super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                cmMakefile::ExpandArguments(mf,&lff_00->Arguments,&expandedArguments,(char *)0x0);
                cmListFileContext::FromCommandContext
                          (&conditionContext,&lff_00->super_cmCommandContext,
                           &(this->super_cmFunctionBlocker).StartingContext.FilePath);
                cmListFileContext::cmListFileContext(&local_78,&conditionContext);
                cmMakefile::GetBacktrace((cmMakefile *)local_160,(cmCommandContext *)mf);
                cmConditionEvaluator::cmConditionEvaluator
                          (&conditionEvaluator,mf,&local_78,(cmListFileBacktrace *)local_160);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_160 + 8));
                cmListFileContext::~cmListFileContext(&local_78);
                bVar4 = cmConditionEvaluator::IsTrue
                                  (&conditionEvaluator,&expandedArguments,&errorString,&messType);
                if (errorString._M_string_length != 0) {
                  cmIfCommandError_abi_cxx11_(&err,&expandedArguments);
                  std::__cxx11::string::append((string *)&err);
                  cmMakefile::GetBacktrace((cmMakefile *)&bt,(cmCommandContext *)mf);
                  pcVar6 = cmMakefile::GetCMakeInstance(mf);
                  cmake::IssueMessage(pcVar6,messType,&err,&bt);
                  if (messType == FATAL_ERROR) {
                    cmSystemTools::s_FatalErrorOccured = true;
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                              (&bt.TopEntry.
                                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
                    std::__cxx11::string::~string((string *)&err);
                    cmConditionEvaluator::~cmConditionEvaluator(&conditionEvaluator);
                    cmListFileContext::~cmListFileContext(&conditionContext);
                    std::
                    vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
                    ~vector(&expandedArguments);
                    std::__cxx11::string::~string((string *)&errorString);
                    goto LAB_0018f322;
                  }
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&bt.TopEntry.
                              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
                  std::__cxx11::string::~string((string *)&err);
                }
                if (bVar4) {
                  this->IsBlocking = false;
                  this->HasRun = true;
                }
                cmConditionEvaluator::~cmConditionEvaluator(&conditionEvaluator);
                cmListFileContext::~cmListFileContext(&conditionContext);
                std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
                ~vector(&expandedArguments);
                std::__cxx11::string::~string((string *)&errorString);
              }
            }
          }
          else {
LAB_0018efa3:
            if (this->IsBlocking == false) {
              status.ReturnInvoked = false;
              status.BreakInvoked = false;
              status.ContinueInvoked = false;
              status.NestedError = false;
              cmMakefile::ExecuteCommand(mf,lff_00,&status);
              if (status.ReturnInvoked == true) {
                inStatus->ReturnInvoked = true;
                goto LAB_0018f322;
              }
              if (status.BreakInvoked == true) {
                inStatus->BreakInvoked = true;
                goto LAB_0018f322;
              }
              if (status.ContinueInvoked == true) {
                inStatus->ContinueInvoked = true;
                goto LAB_0018f322;
              }
            }
          }
          lff_00 = lff_00 + 1;
        } while( true );
      }
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
            (&this->Functions,lff);
  return true;
}

Assistant:

bool cmIfFunctionBlocker::IsFunctionBlocked(const cmListFileFunction& lff,
                                            cmMakefile& mf,
                                            cmExecutionStatus& inStatus)
{
  // we start by recording all the functions
  if (lff.Name.Lower == "if") {
    this->ScopeDepth++;
  } else if (lff.Name.Lower == "endif") {
    this->ScopeDepth--;
    // if this is the endif for this if statement, then start executing
    if (!this->ScopeDepth) {
      // Remove the function blocker for this scope or bail.
      std::unique_ptr<cmFunctionBlocker> fb(
        mf.RemoveFunctionBlocker(this, lff));
      if (!fb) {
        return false;
      }

      // execute the functions for the true parts of the if statement
      cmExecutionStatus status;
      int scopeDepth = 0;
      for (cmListFileFunction const& func : this->Functions) {
        // keep track of scope depth
        if (func.Name.Lower == "if") {
          scopeDepth++;
        }
        if (func.Name.Lower == "endif") {
          scopeDepth--;
        }
        // watch for our state change
        if (scopeDepth == 0 && func.Name.Lower == "else") {

          if (this->ElseSeen) {
            cmListFileBacktrace bt = mf.GetBacktrace(func);
            mf.GetCMakeInstance()->IssueMessage(
              MessageType::FATAL_ERROR,
              "A duplicate ELSE command was found inside an IF block.", bt);
            cmSystemTools::SetFatalErrorOccured();
            return true;
          }

          this->IsBlocking = this->HasRun;
          this->HasRun = true;
          this->ElseSeen = true;

          // if trace is enabled, print a (trivially) evaluated "else"
          // statement
          if (!this->IsBlocking && mf.GetCMakeInstance()->GetTrace()) {
            mf.PrintCommandTrace(func);
          }
        } else if (scopeDepth == 0 && func.Name.Lower == "elseif") {
          if (this->ElseSeen) {
            cmListFileBacktrace bt = mf.GetBacktrace(func);
            mf.GetCMakeInstance()->IssueMessage(
              MessageType::FATAL_ERROR,
              "An ELSEIF command was found after an ELSE command.", bt);
            cmSystemTools::SetFatalErrorOccured();
            return true;
          }

          if (this->HasRun) {
            this->IsBlocking = true;
          } else {
            // if trace is enabled, print the evaluated "elseif" statement
            if (mf.GetCMakeInstance()->GetTrace()) {
              mf.PrintCommandTrace(func);
            }

            std::string errorString;

            std::vector<cmExpandedCommandArgument> expandedArguments;
            mf.ExpandArguments(func.Arguments, expandedArguments);

            MessageType messType;

            cmListFileContext conditionContext =
              cmListFileContext::FromCommandContext(
                func, this->GetStartingContext().FilePath);

            cmConditionEvaluator conditionEvaluator(mf, conditionContext,
                                                    mf.GetBacktrace(func));

            bool isTrue = conditionEvaluator.IsTrue(expandedArguments,
                                                    errorString, messType);

            if (!errorString.empty()) {
              std::string err = cmIfCommandError(expandedArguments);
              err += errorString;
              cmListFileBacktrace bt = mf.GetBacktrace(func);
              mf.GetCMakeInstance()->IssueMessage(messType, err, bt);
              if (messType == MessageType::FATAL_ERROR) {
                cmSystemTools::SetFatalErrorOccured();
                return true;
              }
            }

            if (isTrue) {
              this->IsBlocking = false;
              this->HasRun = true;
            }
          }
        }

        // should we execute?
        else if (!this->IsBlocking) {
          status.Clear();
          mf.ExecuteCommand(func, status);
          if (status.GetReturnInvoked()) {
            inStatus.SetReturnInvoked();
            return true;
          }
          if (status.GetBreakInvoked()) {
            inStatus.SetBreakInvoked();
            return true;
          }
          if (status.GetContinueInvoked()) {
            inStatus.SetContinueInvoked();
            return true;
          }
        }
      }
      return true;
    }
  }

  // record the command
  this->Functions.push_back(lff);

  // always return true
  return true;
}